

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O0

void __thiscall spdlog::logger::dump_backtrace_(logger *this)

{
  bool bVar1;
  logger *plVar2;
  char *pcVar3;
  logger *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  basic_string_view<char> *in_stack_fffffffffffffe60;
  char **ppcVar4;
  anon_class_8_1_8991fb9c *__f;
  function<void_(const_spdlog::details::log_msg_&)> *this_00;
  char *local_170;
  function<void_(const_spdlog::details::log_msg_&)> *in_stack_fffffffffffffe98;
  backtracer *in_stack_fffffffffffffea0;
  undefined1 local_150 [28];
  level_enum in_stack_fffffffffffffecc;
  log_msg *in_stack_fffffffffffffed0;
  string_view_t in_stack_fffffffffffffed8;
  string_view_t in_stack_fffffffffffffee8;
  anon_class_8_1_8991fb9c local_b0 [4];
  function<void_(const_spdlog::details::log_msg_&)> local_90 [3];
  char *local_20;
  anon_class_8_1_8991fb9c *local_18;
  char *local_10;
  char **local_8;
  
  bVar1 = details::backtracer::enabled((backtracer *)0x15e665);
  if (bVar1) {
    name_abi_cxx11_(in_RDI);
    ::fmt::v8::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    __f = local_b0;
    local_20 = "****************** Backtrace Start ******************";
    local_b0[0].this = (logger *)0x1c3f7e;
    local_18 = __f;
    plVar2 = (logger *)strlen("****************** Backtrace Start ******************");
    __f[1].this = plVar2;
    this_00 = local_90;
    details::log_msg::log_msg
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffee8,in_stack_fffffffffffffecc,
               in_stack_fffffffffffffed8);
    (*in_RDI->_vptr_logger[3])(in_RDI,this_00);
    std::function<void(spdlog::details::log_msg_const&)>::
    function<spdlog::logger::dump_backtrace_()::__0,void>(this_00,__f);
    details::backtracer::foreach_pop(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::function<void_(const_spdlog::details::log_msg_&)>::~function
              ((function<void_(const_spdlog::details::log_msg_&)> *)0x15e773);
    name_abi_cxx11_(in_RDI);
    ::fmt::v8::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    ppcVar4 = &local_170;
    local_10 = "****************** Backtrace End ********************";
    local_170 = "****************** Backtrace End ********************";
    local_8 = ppcVar4;
    pcVar3 = (char *)strlen("****************** Backtrace End ********************");
    ppcVar4[1] = pcVar3;
    details::log_msg::log_msg
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffee8,in_stack_fffffffffffffecc,
               in_stack_fffffffffffffed8);
    (*in_RDI->_vptr_logger[3])(in_RDI,local_150);
  }
  return;
}

Assistant:

SPDLOG_INLINE void logger::dump_backtrace_()
{
    using details::log_msg;
    if (tracer_.enabled())
    {
        sink_it_(log_msg{name(), level::info, "****************** Backtrace Start ******************"});
        tracer_.foreach_pop([this](const log_msg &msg) { this->sink_it_(msg); });
        sink_it_(log_msg{name(), level::info, "****************** Backtrace End ********************"});
    }
}